

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

int doBmpTest(char *ext,int width,int align,int height,int pf,int flags)

{
  bool bVar1;
  ulong uVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined6 uVar12;
  undefined8 uVar13;
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  short sVar17;
  undefined4 uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uchar *puVar22;
  char *pcVar23;
  char *pcVar24;
  uchar uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  double dVar30;
  int iVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  char cVar39;
  undefined1 uVar40;
  char cVar41;
  char cVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  uint uVar48;
  int pf_local;
  int loadHeight;
  int loadWidth;
  uint local_138;
  int local_134;
  uint local_130;
  int pixelFormat;
  ulong local_128;
  char *local_120;
  int local_114;
  uint local_110;
  int local_10c;
  char *local_108;
  long local_100;
  uchar *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  char filename [80];
  char md5buf [65];
  char cVar4;
  char cVar5;
  char cVar6;
  
  lVar28 = (long)align;
  iVar21 = tjPixelSize[lVar28];
  uVar26 = (width + iVar21 * 0x23) - 1U & -width;
  loadWidth = 0;
  loadHeight = 0;
  pf_local = align;
  local_134 = align;
  pixelFormat = align;
  local_120 = ext;
  iVar19 = strcasecmp(ext,"ppm");
  pcVar24 = "51976530acf75f02beddf5d21149101d";
  if (iVar19 == 0) {
    pcVar24 = "112c682e82ce5de1cca089e20d60000b";
  }
  local_108 = "6d659071b9bfcdee2def22cb58ddadca";
  if (iVar19 == 0) {
    local_108 = "c0c9f772b464d1896326883a5c79c545";
  }
  if (align == 6) {
    local_108 = pcVar24;
  }
  local_138 = uVar26;
  puVar22 = tjAlloc(uVar26 * 0x27);
  if (puVar22 == (uchar *)0x0) {
    pcVar23 = "ERROR: %s\n";
    pcVar24 = "Could not allocate memory";
LAB_00107a35:
    iVar19 = 0;
    printf(pcVar23,pcVar24);
    exitStatus = -1;
    puVar22 = (uchar *)0x0;
  }
  else {
    local_114 = width + -1;
    local_e0 = (long)tjRedOffset[lVar28];
    local_e8 = (long)tjGreenOffset[lVar28];
    local_f0 = (long)tjBlueOffset[lVar28];
    iVar20 = 0;
    iVar19 = local_134;
    local_130 = -width;
    local_128 = (ulong)(uint)width;
    local_110 = height;
    local_100 = lVar28;
    local_f8 = puVar22;
    while (puVar22 = local_f8, uVar26 = local_110, iVar20 != 0x27) {
      iVar29 = 0x26 - iVar20;
      if ((local_110 & 2) == 0) {
        iVar29 = iVar20;
      }
      uVar2 = (ulong)(uint)(iVar20 << 8) / 0x27;
      uVar26 = (uint)uVar2;
      dVar47 = (double)(uVar26 & 0xff) / -255.0 + 1.0;
      puVar22 = local_f8 + (int)(iVar29 * local_138);
      local_10c = iVar20;
      for (lVar28 = 0; lVar28 != 0x2300; lVar28 = lVar28 + 0x100) {
        uVar48 = (ushort)lVar28 / 0x23;
        uVar27 = uVar26 + uVar48;
        memset(puVar22,0,(long)iVar21);
        uVar25 = (uchar)uVar27;
        if (local_134 == 0xb) {
          dVar30 = 1.0 - (double)(uVar48 & 0xff) / 255.0;
          dVar45 = 1.0 - (double)(uVar27 & 0xff) / 255.0;
          uVar32 = SUB81(dVar30,0);
          uVar33 = (undefined1)((ulong)dVar30 >> 8);
          uVar34 = (undefined1)((ulong)dVar30 >> 0x10);
          uVar35 = (undefined1)((ulong)dVar30 >> 0x18);
          uVar36 = (undefined1)((ulong)dVar30 >> 0x20);
          uVar37 = (undefined1)((ulong)dVar30 >> 0x28);
          uVar38 = (undefined1)((ulong)dVar30 >> 0x30);
          uVar40 = (undefined1)((ulong)dVar30 >> 0x38);
          if (dVar47 <= dVar30) {
            uVar32 = SUB81(dVar47,0);
            uVar33 = (undefined1)((ulong)dVar47 >> 8);
            uVar34 = (undefined1)((ulong)dVar47 >> 0x10);
            uVar35 = (undefined1)((ulong)dVar47 >> 0x18);
            uVar36 = (undefined1)((ulong)dVar47 >> 0x20);
            uVar37 = (undefined1)((ulong)dVar47 >> 0x28);
            uVar38 = (undefined1)((ulong)dVar47 >> 0x30);
            uVar40 = (undefined1)((ulong)dVar47 >> 0x38);
          }
          if (dVar45 <= (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32)))))))) {
            uVar32 = SUB81(dVar45,0);
            uVar33 = (undefined1)((ulong)dVar45 >> 8);
            uVar34 = (undefined1)((ulong)dVar45 >> 0x10);
            uVar35 = (undefined1)((ulong)dVar45 >> 0x18);
            uVar36 = (undefined1)((ulong)dVar45 >> 0x20);
            uVar37 = (undefined1)((ulong)dVar45 >> 0x28);
            uVar38 = (undefined1)((ulong)dVar45 >> 0x30);
            uVar40 = (undefined1)((ulong)dVar45 >> 0x38);
          }
          bVar1 = NAN((double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32))))))));
          if ((!bVar1 && (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32))))))) != 1.0) || (bVar1)) {
            dVar46 = 1.0 - (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32)))))));
            dVar30 = (dVar30 - (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(
                                                  uVar36,CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(
                                                  uVar33,uVar32)))))))) / dVar46;
            auVar43._0_8_ =
                 dVar47 - (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32)))))));
            auVar43._8_8_ =
                 dVar45 - (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32)))))));
            auVar44._8_8_ = dVar46;
            auVar44._0_8_ = dVar46;
            auVar44 = divpd(auVar43,auVar44);
          }
          else {
            auVar44 = ZEXT816(0);
            dVar30 = 0.0;
          }
          iVar29 = (int)((255.0 - auVar44._8_8_ * 255.0) + 0.5);
          iVar31 = (int)((255.0 - (double)CONCAT17(uVar40,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(
                                                  uVar36,CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(
                                                  uVar33,uVar32))))))) * 255.0) + 0.5);
          iVar19 = (int)((255.0 - dVar30 * 255.0) + 0.5);
          iVar20 = (int)((255.0 - auVar44._0_8_ * 255.0) + 0.5);
          cVar39 = (char)((uint)iVar20 >> 0x10);
          cVar41 = (char)((uint)iVar29 >> 0x10);
          cVar42 = (char)((uint)iVar31 >> 0x10);
          uVar12 = CONCAT15((char)((uint)iVar20 >> 8),CONCAT14((char)iVar20,iVar19));
          uVar13 = CONCAT17((char)((uint)iVar20 >> 0x18),CONCAT16(cVar39,uVar12));
          Var14 = CONCAT19((char)((uint)iVar29 >> 8),CONCAT18((char)iVar29,uVar13));
          auVar15[10] = cVar41;
          auVar15._0_10_ = Var14;
          auVar15[0xb] = (char)((uint)iVar29 >> 0x18);
          auVar16[0xc] = (char)iVar31;
          auVar16._0_12_ = auVar15;
          auVar16[0xd] = (char)((uint)iVar31 >> 8);
          auVar11[0xe] = cVar42;
          auVar11._0_14_ = auVar16;
          auVar11[0xf] = (char)((uint)iVar31 >> 0x18);
          sVar7 = (short)iVar19;
          cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar19 - (0xff < sVar7);
          sVar7 = (short)((uint)iVar19 >> 0x10);
          sVar8 = (short)((uint6)uVar12 >> 0x20);
          cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
          sVar8 = (short)((ulong)uVar13 >> 0x30);
          sVar9 = (short)((unkuint10)Var14 >> 0x40);
          cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar29 - (0xff < sVar9);
          sVar9 = auVar15._10_2_;
          sVar10 = auVar16._12_2_;
          cVar6 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar31 - (0xff < sVar10);
          sVar10 = auVar11._14_2_;
          sVar17 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                            (0xff < sVar7),cVar3);
          uVar18 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar39 - (0xff < sVar8),
                            CONCAT12(cVar4,sVar17));
          uVar12 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar41 - (0xff < sVar9),
                            CONCAT14(cVar5,uVar18));
          sVar7 = (short)((uint)uVar18 >> 0x10);
          sVar8 = (short)((uint6)uVar12 >> 0x20);
          sVar9 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar42 - (0xff < sVar10),
                                   CONCAT16(cVar6,uVar12)) >> 0x30);
          *(uint *)puVar22 =
               CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                 CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                          (0 < sVar17) * (sVar17 < 0x100) * cVar3 - (0xff < sVar17))
                                ));
        }
        else if (local_134 == 6) {
          *puVar22 = uVar25;
        }
        else {
          puVar22[local_e0] = (uchar)uVar48;
          puVar22[local_e8] = (uchar)uVar2;
          puVar22[local_f0] = uVar25;
        }
        puVar22 = puVar22 + iVar21;
        iVar19 = local_134;
      }
      iVar20 = local_10c + 1;
    }
    pcVar24 = "bu";
    if ((local_110 & 2) == 0) {
      pcVar24 = "td";
    }
    snprintf(filename,0x50,"test_bmp_%s_%d_%s.%s",pixFormatStr[local_100],local_128,pcVar24,
             local_120);
    uVar48 = uVar26;
    iVar21 = tjSaveImage(filename,puVar22,0x23,local_138,0x27,iVar19,uVar26);
    if (iVar21 == -1) {
      pcVar24 = tjGetErrorStr();
      printf("TurboJPEG ERROR:\n%s\n",pcVar24);
    }
    else {
      pcVar23 = MD5File(filename,md5buf);
      pcVar24 = local_108;
      iVar21 = strcasecmp(pcVar23,local_108);
      if (iVar21 == 0) {
        tjFree(puVar22);
        uVar27 = uVar26;
        puVar22 = tjLoadImage(filename,&loadWidth,(int)local_128,&loadHeight,&pf_local,uVar26);
        iVar21 = pf_local;
        if (puVar22 == (uchar *)0x0) goto LAB_00107c86;
        if ((loadWidth == 0x23) && (loadHeight == 0x27)) {
          iVar19 = cmpBitmap(puVar22,local_138,pf_local,uVar26,0,uVar27,uVar48);
          if (iVar19 != 0) {
            if (iVar21 == 6) {
              tjFree(puVar22);
              pf_local = 4;
              iVar21 = (int)local_128;
              uVar27 = uVar26;
              puVar22 = tjLoadImage(filename,&loadWidth,iVar21,&loadHeight,&pf_local,uVar26);
              iVar19 = local_114;
              if (puVar22 != (uchar *)0x0) {
                iVar20 = cmpBitmap(puVar22,tjPixelSize[pf_local] * 0x23 + local_114 & local_130,
                                   pf_local,uVar26,1,uVar27,uVar48);
                if (iVar20 == 0) {
                  pcVar24 = "\n   Converting %s to RGB failed\n";
                }
                else {
                  tjFree(puVar22);
                  pf_local = 0xb;
                  uVar27 = uVar26;
                  puVar22 = tjLoadImage(filename,&loadWidth,iVar21,&loadHeight,&pf_local,uVar26);
                  if (puVar22 == (uchar *)0x0) goto LAB_00107c86;
                  iVar19 = cmpBitmap(puVar22,iVar19 + tjPixelSize[pf_local] * 0x23 & local_130,
                                     pf_local,uVar26,1,uVar27,uVar48);
                  if (iVar19 != 0) goto LAB_00107c16;
                  pcVar24 = "\n   Converting %s to CMYK failed\n";
                }
                goto LAB_00107bf9;
              }
            }
            else {
              iVar21 = (int)local_128;
LAB_00107c16:
              tjFree(puVar22);
              pf_local = local_134;
              pixelFormat = -1;
              puVar22 = tjLoadImage(filename,&loadWidth,iVar21,&loadHeight,&pixelFormat,uVar26);
              iVar21 = pixelFormat;
              if (puVar22 != (uchar *)0x0) {
                lVar28 = (long)pixelFormat;
                if ((pf_local == 6 && pixelFormat != 6) ||
                   ((iVar19 = 0, pf_local != 6 &&
                    ((iVar20 = strcasecmp(local_120,"bmp"), iVar20 == 0 && iVar21 != 1 ||
                     (iVar20 = strcasecmp(local_120,"ppm"), iVar21 != 0 && iVar20 == 0)))))) {
                  printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
                         pixFormatStr[lVar28]);
                  iVar19 = -1;
                }
                unlink(filename);
                goto LAB_00107a65;
              }
            }
LAB_00107c86:
            pcVar24 = tjGetErrorStr();
            pcVar23 = "TurboJPEG ERROR:\n%s\n";
            goto LAB_00107a35;
          }
          pcVar24 = "\n   Pixel data in %s is bogus\n";
        }
        else {
          pcVar24 = "\n   Image dimensions of %s are bogus\n";
        }
LAB_00107bf9:
        printf(pcVar24,filename);
        iVar19 = -1;
        goto LAB_00107a65;
      }
      printf("\n%s has an MD5 sum of %s.\n   Should be %s.\n",filename,pcVar23,pcVar24);
    }
    iVar19 = 0;
    exitStatus = -1;
  }
LAB_00107a65:
  tjFree(puVar22);
  if (exitStatus < 0) {
    iVar19 = exitStatus;
  }
  return iVar19;
}

Assistant:

static int doBmpTest(const char *ext, int width, int align, int height, int pf,
                     int flags)
{
  char filename[80], *md5sum, md5buf[65];
  int ps = tjPixelSize[pf], pitch = PAD(width * ps, align), loadWidth = 0,
    loadHeight = 0, retval = 0, pixelFormat = pf;
  unsigned char *buf = NULL;
  char *md5ref;

  if (pf == TJPF_GRAY) {
    md5ref = !strcasecmp(ext, "ppm") ? "112c682e82ce5de1cca089e20d60000b" :
                                       "51976530acf75f02beddf5d21149101d";
  } else {
    md5ref = !strcasecmp(ext, "ppm") ? "c0c9f772b464d1896326883a5c79c545" :
                                       "6d659071b9bfcdee2def22cb58ddadca";
  }

  if ((buf = (unsigned char *)tjAlloc(pitch * height)) == NULL)
    THROW("Could not allocate memory");
  initBitmap(buf, width, pitch, height, pf, flags);

  snprintf(filename, 80, "test_bmp_%s_%d_%s.%s", pixFormatStr[pf], align,
           (flags & TJFLAG_BOTTOMUP) ? "bu" : "td", ext);
  TRY_TJ(tjSaveImage(filename, buf, width, pitch, height, pf, flags));
  md5sum = MD5File(filename, md5buf);
  if (strcasecmp(md5sum, md5ref))
    THROW_MD5(filename, md5sum, md5ref);

  tjFree(buf);  buf = NULL;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                         flags)) == NULL)
    THROW_TJ();
  if (width != loadWidth || height != loadHeight) {
    printf("\n   Image dimensions of %s are bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (!cmpBitmap(buf, width, pitch, height, pf, flags, 0)) {
    printf("\n   Pixel data in %s is bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (pf == TJPF_GRAY) {
    tjFree(buf);  buf = NULL;
    pf = TJPF_XBGR;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to RGB failed\n", filename);
      retval = -1;  goto bailout;
    }

    tjFree(buf);  buf = NULL;
    pf = TJPF_CMYK;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to CMYK failed\n", filename);
      retval = -1;  goto bailout;
    }
  }
  /* Verify that tjLoadImage() returns the proper "preferred" pixel format for
     the file type. */
  tjFree(buf);  buf = NULL;
  pf = pixelFormat;
  pixelFormat = TJPF_UNKNOWN;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight,
                         &pixelFormat, flags)) == NULL)
    THROW_TJ();
  if ((pf == TJPF_GRAY && pixelFormat != TJPF_GRAY) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "bmp") &&
       pixelFormat != TJPF_BGR) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "ppm") &&
       pixelFormat != TJPF_RGB)) {
    printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
           pixFormatStr[pixelFormat]);
    retval = -1;
  }
  unlink(filename);

bailout:
  tjFree(buf);
  if (exitStatus < 0) return exitStatus;
  return retval;
}